

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

bool __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::ValidThreadAccess(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                    *this)

{
  DWORD DVar1;
  ThreadContextId pvVar2;
  DWORD DVar3;
  ThreadContextId pvVar4;
  bool bVar5;
  
  DVar3 = GetCurrentThreadId();
  bVar5 = true;
  if (this->disableThreadAccessCheck == false) {
    DVar1 = this->concurrentThreadId;
    pvVar2 = this->threadContextHandle;
    if ((DVar1 != 0xffffffff || pvVar2 != (ThreadContextId)0x0) &&
       (DVar1 == 0xffffffff || DVar1 != DVar3)) {
      pvVar4 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      bVar5 = pvVar2 == pvVar4;
    }
  }
  return bVar5;
}

Assistant:

bool ValidThreadAccess()
    {
        DWORD currentThreadId = ::GetCurrentThreadId();
        return disableThreadAccessCheck ||
            (this->concurrentThreadId == -1 && this->threadContextHandle == NULL) ||  // JIT thread after close
            (this->concurrentThreadId != -1 && this->concurrentThreadId == currentThreadId) ||
            this->threadContextHandle == GetCurrentThreadContextId();
    }